

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O0

void __thiscall sf::priv::GlContext::initialize(GlContext *this,ContextSettings *requestedSettings)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  uint local_4c;
  char *pcStack_48;
  int profile;
  char *extensionString;
  uint i;
  int numExtensions;
  glGetStringiFuncType glGetStringiFunc;
  char *pcStack_28;
  int flags;
  char *version;
  int minorVersion;
  int majorVersion;
  ContextSettings *requestedSettings_local;
  GlContext *this_local;
  
  _minorVersion = requestedSettings;
  requestedSettings_local = (ContextSettings *)this;
  setActive(this,true);
  version._4_4_ = 0;
  version._0_4_ = 0;
  glGetIntegerv(0x821b,(long)&version + 4);
  glGetIntegerv(0x821c,&version);
  iVar3 = glGetError();
  if (iVar3 == 0x500) {
    (this->m_settings).majorVersion = 1;
    (this->m_settings).minorVersion = 1;
    pcStack_28 = (char *)glGetString(0x1f02);
    if (pcStack_28 == (char *)0x0) {
      poVar5 = err();
      poVar5 = std::operator<<(poVar5,"Unable to retrieve OpenGL version string, defaulting to 1.1")
      ;
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    else {
      bVar1 = anon_unknown.dwarf_75488::parseVersionString
                        (pcStack_28,"OpenGL ES-CL ",&(this->m_settings).majorVersion,
                         &(this->m_settings).minorVersion);
      if ((((!bVar1) &&
           (bVar1 = anon_unknown.dwarf_75488::parseVersionString
                              (pcStack_28,"OpenGL ES-CM ",&(this->m_settings).majorVersion,
                               &(this->m_settings).minorVersion), !bVar1)) &&
          (bVar1 = anon_unknown.dwarf_75488::parseVersionString
                             (pcStack_28,"OpenGL ES ",&(this->m_settings).majorVersion,
                              &(this->m_settings).minorVersion), !bVar1)) &&
         (bVar1 = anon_unknown.dwarf_75488::parseVersionString
                            (pcStack_28,"",&(this->m_settings).majorVersion,
                             &(this->m_settings).minorVersion), !bVar1)) {
        poVar5 = err();
        poVar5 = std::operator<<(poVar5,"Unable to parse OpenGL version string: \"");
        poVar5 = std::operator<<(poVar5,pcStack_28);
        poVar5 = std::operator<<(poVar5,"\", defaulting to 1.1");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  else {
    (this->m_settings).majorVersion = version._4_4_;
    (this->m_settings).minorVersion = (uint)version;
  }
  (this->m_settings).attributeFlags = 0;
  if (2 < (this->m_settings).majorVersion) {
    glGetStringiFunc._4_4_ = 0;
    glGetIntegerv(0x821e,(long)&glGetStringiFunc + 4);
    if ((glGetStringiFunc._4_4_ & 2) != 0) {
      (this->m_settings).attributeFlags = (this->m_settings).attributeFlags | 4;
    }
    if (((this->m_settings).majorVersion == 3) && ((this->m_settings).minorVersion == 1)) {
      (this->m_settings).attributeFlags = (this->m_settings).attributeFlags | 1;
      _i = getFunction("glGetStringi");
      if (_i != (GlFunctionPointer)0x0) {
        extensionString._4_4_ = 0;
        glGetIntegerv(0x821d,(long)&extensionString + 4);
        for (extensionString._0_4_ = 0; (uint)extensionString < extensionString._4_4_;
            extensionString._0_4_ = (uint)extensionString + 1) {
          pcStack_48 = (char *)(*_i)(0x1f03,(ulong)(uint)extensionString);
          pcVar4 = strstr(pcStack_48,"GL_ARB_compatibility");
          if (pcVar4 != (char *)0x0) {
            (this->m_settings).attributeFlags = (this->m_settings).attributeFlags & 0xfffffffe;
            break;
          }
        }
      }
    }
    else if ((3 < (this->m_settings).majorVersion) || (1 < (this->m_settings).minorVersion)) {
      local_4c = 0;
      glGetIntegerv(0x9126,&local_4c);
      if ((local_4c & 1) != 0) {
        (this->m_settings).attributeFlags = (this->m_settings).attributeFlags | 1;
      }
    }
  }
  if ((_minorVersion->antialiasingLevel == 0) || ((this->m_settings).antialiasingLevel == 0)) {
    (this->m_settings).antialiasingLevel = 0;
  }
  else {
    glEnable(0x809d);
  }
  if (((_minorVersion->sRgbCapable & 1U) == 0) || (((this->m_settings).sRgbCapable & 1U) == 0)) {
    (this->m_settings).sRgbCapable = false;
  }
  else {
    glEnable(0x8db9);
    cVar2 = glIsEnabled(0x8db9);
    if (cVar2 == '\0') {
      poVar5 = err();
      poVar5 = std::operator<<(poVar5,"Warning: Failed to enable GL_FRAMEBUFFER_SRGB");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      (this->m_settings).sRgbCapable = false;
    }
  }
  return;
}

Assistant:

void GlContext::initialize(const ContextSettings& requestedSettings)
{
    // Activate the context
    setActive(true);

    // Retrieve the context version number
    int majorVersion = 0;
    int minorVersion = 0;

    // Try the new way first
    glGetIntegerv(GL_MAJOR_VERSION, &majorVersion);
    glGetIntegerv(GL_MINOR_VERSION, &minorVersion);

    if (glGetError() != GL_INVALID_ENUM)
    {
        m_settings.majorVersion = static_cast<unsigned int>(majorVersion);
        m_settings.minorVersion = static_cast<unsigned int>(minorVersion);
    }
    else
    {
        // Try the old way

        // If we can't get the version number, assume 1.1
        m_settings.majorVersion = 1;
        m_settings.minorVersion = 1;

        const char* version = reinterpret_cast<const char*>(glGetString(GL_VERSION));
        if (version)
        {
            // OpenGL ES Common Lite profile: The beginning of the returned string is "OpenGL ES-CL major.minor"
            // OpenGL ES Common profile:      The beginning of the returned string is "OpenGL ES-CM major.minor"
            // OpenGL ES Full profile:        The beginning of the returned string is "OpenGL ES major.minor"
            // Desktop OpenGL:                The beginning of the returned string is "major.minor"

            if (!parseVersionString(version, "OpenGL ES-CL ", m_settings.majorVersion, m_settings.minorVersion) &&
                !parseVersionString(version, "OpenGL ES-CM ", m_settings.majorVersion, m_settings.minorVersion) &&
                !parseVersionString(version, "OpenGL ES ",    m_settings.majorVersion, m_settings.minorVersion) &&
                !parseVersionString(version, "",              m_settings.majorVersion, m_settings.minorVersion))
            {
                err() << "Unable to parse OpenGL version string: \"" << version << "\", defaulting to 1.1" << std::endl;
            }
        }
        else
        {
            err() << "Unable to retrieve OpenGL version string, defaulting to 1.1" << std::endl;
        }
    }

    // 3.0 contexts only deprecate features, but do not remove them yet
    // 3.1 contexts remove features if ARB_compatibility is not present
    // 3.2+ contexts remove features only if a core profile is requested

    // If the context was created with wglCreateContext, it is guaranteed to be compatibility.
    // If a 3.0 context was created with wglCreateContextAttribsARB, it is guaranteed to be compatibility.
    // If a 3.1 context was created with wglCreateContextAttribsARB, the compatibility flag
    // is set only if ARB_compatibility is present
    // If a 3.2+ context was created with wglCreateContextAttribsARB, the compatibility flag
    // would have been set correctly already depending on whether ARB_create_context_profile is supported.

    // If the user requests a 3.0 context, it will be a compatibility context regardless of the requested profile.
    // If the user requests a 3.1 context and its creation was successful, the specification
    // states that it will not be a compatibility profile context regardless of the requested
    // profile unless ARB_compatibility is present.

    m_settings.attributeFlags = ContextSettings::Default;

    if (m_settings.majorVersion >= 3)
    {
        // Retrieve the context flags
        int flags = 0;
        glGetIntegerv(GL_CONTEXT_FLAGS, &flags);

        if (flags & GL_CONTEXT_FLAG_DEBUG_BIT)
            m_settings.attributeFlags |= ContextSettings::Debug;

        if ((m_settings.majorVersion == 3) && (m_settings.minorVersion == 1))
        {
            m_settings.attributeFlags |= ContextSettings::Core;

            glGetStringiFuncType glGetStringiFunc = reinterpret_cast<glGetStringiFuncType>(getFunction("glGetStringi"));

            if (glGetStringiFunc)
            {
                int numExtensions = 0;
                glGetIntegerv(GL_NUM_EXTENSIONS, &numExtensions);

                for (unsigned int i = 0; i < static_cast<unsigned int>(numExtensions); ++i)
                {
                    const char* extensionString = reinterpret_cast<const char*>(glGetStringiFunc(GL_EXTENSIONS, i));

                    if (std::strstr(extensionString, "GL_ARB_compatibility"))
                    {
                        m_settings.attributeFlags &= ~static_cast<Uint32>(ContextSettings::Core);
                        break;
                    }
                }
            }
        }
        else if ((m_settings.majorVersion > 3) || (m_settings.minorVersion >= 2))
        {
            // Retrieve the context profile
            int profile = 0;
            glGetIntegerv(GL_CONTEXT_PROFILE_MASK, &profile);

            if (profile & GL_CONTEXT_CORE_PROFILE_BIT)
                m_settings.attributeFlags |= ContextSettings::Core;
        }
    }

    // Enable anti-aliasing if requested by the user and supported
    if ((requestedSettings.antialiasingLevel > 0) && (m_settings.antialiasingLevel > 0))
    {
        glEnable(GL_MULTISAMPLE);
    }
    else
    {
        m_settings.antialiasingLevel = 0;
    }

    // Enable sRGB if requested by the user and supported
    if (requestedSettings.sRgbCapable && m_settings.sRgbCapable)
    {
        glEnable(GL_FRAMEBUFFER_SRGB);

        // Check to see if the enable was successful
        if (glIsEnabled(GL_FRAMEBUFFER_SRGB) == GL_FALSE)
        {
            err() << "Warning: Failed to enable GL_FRAMEBUFFER_SRGB" << std::endl;
            m_settings.sRgbCapable = false;
        }
    }
    else
    {
        m_settings.sRgbCapable = false;
    }
}